

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_imul(ExecutionEngine *this)

{
  undefined1 auVar1 [16];
  VMStack *this_00;
  Frame *this_01;
  Value VVar2;
  Value VVar3;
  undefined1 local_40 [8];
  Value value_1;
  Value value_2;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar2 = Frame::popTopOfOperandStack(this_01);
  VVar3 = Frame::popTopOfOperandStack(this_01);
  value_1.data.longValue._4_4_ = VVar2.type;
  if (value_1.data.longValue._4_4_ != 4) {
    __assert_fail("value_2.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x82b,"void ExecutionEngine::i_imul()");
  }
  local_40._4_4_ = VVar3.type;
  if (local_40._4_4_ == INT) {
    stack0xffffffffffffffc4 = VVar3._4_12_;
    local_40._0_4_ = 4;
    auVar1 = _local_40;
    value_1.printType = VVar3.data._0_4_;
    value_2.printType = VVar2.data._0_4_;
    value_1.type = VVar3.data._4_4_;
    local_40 = auVar1._0_8_;
    value_1.printType = value_1.printType * value_2.printType;
    VVar2.data = (anon_union_8_10_52016fac_for_data)value_1._0_8_;
    VVar2.printType = local_40._0_4_;
    VVar2.type = local_40._4_4_;
    Frame::pushIntoOperandStack(this_01,VVar2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_1.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x82c,"void ExecutionEngine::i_imul()");
}

Assistant:

void ExecutionEngine::i_imul() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value_2 = topFrame->popTopOfOperandStack();
	Value value_1 = topFrame->popTopOfOperandStack();

	assert(value_2.type == ValueType::INT);
	assert(value_1.type == ValueType::INT);

    value_1.printType = ValueType::INT;
	value_1.data.intValue = value_1.data.intValue * (value_2.data.intValue);
	topFrame->pushIntoOperandStack(value_1);

	topFrame->pc += 1;
}